

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor2008.h
# Opt level: O2

uint32_t FastPForLib::PFor2008::determineBestBase(DATATYPE *in,size_t size,uint32_t maxb)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  size_t sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 in_ZMM0 [64];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_XMM8 [16];
  allocator_type local_41;
  vector<unsigned_int,_std::allocator<unsigned_int>_> freqs;
  
  auVar12 = in_ZMM0._0_16_;
  if (size == 0) {
    uVar8 = 0;
  }
  else {
    sVar10 = 0x10000;
    if (size < 0x10000) {
      sVar10 = size;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&freqs,0x21,&local_41);
    uVar7 = 0;
    if (0x10000 < size) {
      uVar4 = rand();
      uVar7 = (ulong)uVar4 % (ulong)(uint)((int)size - (int)sVar10);
    }
    uVar5 = uVar7 + sVar10;
    for (; uVar7 < uVar5; uVar7 = (ulong)((int)uVar7 + 1)) {
      uVar4 = in[uVar7];
      if (uVar4 == 0) {
        uVar4 = 0;
      }
      else {
        iVar6 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        uVar4 = iVar6 + 1;
      }
      freqs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] =
           freqs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar4] + 1;
    }
    auVar12 = vcvtusi2sd_avx512f(auVar12,maxb);
    iVar6 = 0;
    uVar8 = maxb;
    uVar9 = maxb;
    auVar11 = auVar12;
    while (uVar4 = uVar9 - 1, uVar4 < maxb) {
      iVar6 = iVar6 + freqs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar9];
      auVar15 = vcvtusi2sd_avx512f(in_XMM8,iVar6);
      auVar14._0_8_ = auVar15._0_8_ / (double)(long)sVar10;
      auVar14._8_8_ = auVar15._8_8_;
      if (iVar6 != 0) {
        auVar3 = vfmadd213sd_fma(ZEXT816(0x4060000000000000),auVar14,ZEXT816(0xbff0000000000000));
        auVar15 = vcvtusi2sd_avx512f(in_XMM8,1 << (uVar4 & 0x1f));
        auVar15._0_8_ = auVar3._0_8_ / (auVar14._0_8_ * auVar15._0_8_);
        auVar15._8_8_ = auVar3._8_8_;
        auVar14 = vmaxsd_avx(auVar15,auVar14);
      }
      auVar15 = vcvtusi2sd_avx512f(in_XMM8,uVar4);
      auVar14 = vfmadd231sd_fma(auVar15,auVar12,auVar14);
      dVar13 = auVar11._0_8_;
      uVar1 = vcmpsd_avx512f(auVar14,auVar11,6);
      bVar2 = (bool)((byte)uVar1 & 1);
      auVar11._0_8_ = (ulong)bVar2 * (long)dVar13 + (ulong)!bVar2 * (long)auVar14._0_8_;
      auVar11._8_8_ = auVar14._8_8_;
      uVar9 = uVar4;
      if (auVar14._0_8_ <= dVar13) {
        uVar8 = uVar4;
      }
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&freqs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  return uVar8;
}

Assistant:

static uint32_t determineBestBase(const DATATYPE *in, size_t size,
                                    const uint32_t maxb) {
    if (size == 0)
      return 0;
    const size_t defaultsamplesize = 64 * 1024;
    // the original paper describes sorting
    // a sample, but this only makes sense if you
    // are coding a frame of reference.
    size_t samplesize = size > defaultsamplesize ? defaultsamplesize : size;
    std::vector<uint32_t> freqs(33);
    // we choose the sample to be consecutive
    uint32_t rstart =
        size > samplesize
            ? (rand() % (static_cast<uint32_t>(size - samplesize)))
            : 0U;
    for (uint32_t k = rstart; k < rstart + samplesize; ++k) {
      freqs[asmbits(in[k])]++;
    }
    uint32_t bestb = maxb;
    uint32_t numberofexceptions = 0;
    double Erate = 0;
    double bestcost = maxb;
    for (uint32_t b = bestb - 1; b < maxb; --b) {
      numberofexceptions += freqs[b + 1];
      Erate = static_cast<double>(numberofexceptions) /
              static_cast<double>(samplesize);
      /**
       * though this is not explicit in the original paper, you
       * need to somehow compensate for compulsory exceptions
       * when the chosen number of bits is small.
       *
       * We use their formula (3.1.5) to estimate actual number
       * of total exceptions, including compulsory exceptions.
       */
      if (numberofexceptions > 0) {
        double altErate = (Erate * 128 - 1) / (Erate * (1U << b));
        if (altErate > Erate)
          Erate = altErate;
      }
      const double thiscost = b + Erate * maxb;
      if (thiscost <= bestcost) {
        bestcost = thiscost;
        bestb = b;
      }
    }
    return bestb;
  }